

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O0

void test_median(GlobalArray *g_a,GlobalArray *g_b,GlobalArray *g_c,GlobalArray *g_m)

{
  int iVar1;
  GAServices *this;
  float fVar2;
  double dVar3;
  int dims [7];
  int ndim;
  int type;
  int me;
  DoubleComplex dcval3;
  long lval3;
  float fval3;
  double dval3;
  int ival3;
  void *val3;
  DoubleComplex dcval2;
  long lval2;
  float fval2;
  double dval2;
  int ival2;
  void *val2;
  DoubleComplex dcval;
  long lval;
  float fval;
  double dval;
  int ival;
  void *val;
  DoubleComplex bdc;
  DoubleComplex adc;
  double bd;
  double ad;
  float bf;
  float af;
  long bl;
  long al;
  int bi;
  int ai;
  void *beta;
  void *alpha;
  DoubleComplex dcmax;
  DoubleComplex dcmin;
  double dmax;
  double dmin;
  long lmax;
  long lmin;
  float fmax;
  float fmin;
  int imax;
  int imin;
  void *max;
  void *min;
  int index [7];
  GlobalArray *g_e;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  GAServices *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  GlobalArray *in_stack_fffffffffffffdd0;
  GlobalArray *in_stack_fffffffffffffdd8;
  GAServices *in_stack_fffffffffffffde0;
  int local_214;
  undefined4 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined4 local_194;
  undefined8 local_190;
  undefined4 local_184;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined4 local_15c;
  undefined8 local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined4 local_124;
  undefined8 local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 *local_b8;
  undefined8 *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  float local_68;
  float local_64;
  int local_60;
  int local_5c;
  double *local_58;
  double *local_50;
  GlobalArray *local_28;
  
  local_bc = 1;
  local_c0 = 0xffffffff;
  local_c8 = 1;
  local_d0 = 0xffffffffffffffff;
  local_d4 = 0x3f800000;
  local_d8 = 0xbf800000;
  local_e0 = 0x3ff0000000000000;
  local_e8 = 0xbff0000000000000;
  local_f8 = 0x3ff0000000000000;
  uStack_f0 = 0;
  local_108 = 0xbff0000000000000;
  uStack_100 = 0;
  local_114 = 0xfffffffe;
  local_120 = 0xc000000000000000;
  local_124 = 0xc0000000;
  local_130 = 0xfffffffffffffffe;
  local_14c = 6;
  local_158 = 0x4018000000000000;
  local_15c = 0x40c00000;
  local_168 = 6;
  local_184 = 4;
  local_190 = 0x4010000000000000;
  local_194 = 0x40800000;
  local_1a0 = 4;
  iVar1 = GA_Nodeid();
  GA::GlobalArray::inquire
            (in_stack_fffffffffffffdd0,
             (int *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (int *)in_stack_fffffffffffffdc0,
             (int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  switch(local_1b8) {
  case 0x3e9:
    local_b0 = (undefined8 *)&local_bc;
    local_b8 = (undefined8 *)&local_c0;
    break;
  case 0x3ea:
    local_b0 = &local_c8;
    local_b8 = &local_d0;
    break;
  case 0x3eb:
    local_b0 = (undefined8 *)&local_d4;
    local_b8 = (undefined8 *)&local_d8;
    break;
  case 0x3ec:
    local_b0 = &local_e0;
    local_b8 = &local_e8;
    break;
  default:
    GA::GAServices::error
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
    break;
  case 0x3ef:
    local_b0 = &local_f8;
    local_b8 = &local_108;
  }
  local_140 = 0xc000000000000000;
  local_138 = 0x8000000000000000;
  local_178 = 0x4018000000000000;
  local_170 = 0;
  local_1b0 = 0x4010000000000000;
  local_1a8 = 0;
  switch(local_1b8) {
  case 0x3e9:
    local_110 = (undefined8 *)&local_114;
    local_148 = (undefined8 *)&local_14c;
    local_180 = (undefined8 *)&local_184;
    break;
  case 0x3ea:
    local_110 = &local_130;
    local_148 = &local_168;
    local_180 = &local_1a0;
    break;
  case 0x3eb:
    local_110 = (undefined8 *)&local_124;
    local_148 = (undefined8 *)&local_15c;
    local_180 = (undefined8 *)&local_194;
    break;
  case 0x3ec:
    local_110 = &local_120;
    local_148 = &local_158;
    local_180 = &local_190;
    break;
  default:
    GA_Error((char *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    break;
  case 0x3ef:
    local_110 = &local_140;
    local_148 = &local_178;
    local_180 = &local_1b0;
  }
  if (iVar1 == 0) {
    printf("Testing GA_Median...");
  }
  GA::GlobalArray::zero((GlobalArray *)0x105dfb);
  GA::GlobalArray::zero((GlobalArray *)0x105e08);
  GA::GlobalArray::zero((GlobalArray *)0x105e15);
  GA::GlobalArray::zero((GlobalArray *)0x105e22);
  GA::GlobalArray::fill
            ((GlobalArray *)in_stack_fffffffffffffdc0,
             (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  GA::GlobalArray::fill
            ((GlobalArray *)in_stack_fffffffffffffdc0,
             (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  GA::GlobalArray::fill
            ((GlobalArray *)in_stack_fffffffffffffdc0,
             (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  GA::GlobalArray::median
            (in_stack_fffffffffffffdd0,
             (GlobalArray *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (GlobalArray *)in_stack_fffffffffffffdc0,
             (GlobalArray *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_28 = GA::GAServices::createGA
                       (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (char *)in_stack_fffffffffffffdd0);
  GA::GlobalArray::add
            (in_stack_fffffffffffffdd0,
             (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (GlobalArray *)in_stack_fffffffffffffdc0,
             (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             (GlobalArray *)0x105ed6);
  switch(local_1b8) {
  case 0x3e9:
    local_58 = (double *)&local_60;
    local_50 = (double *)&local_5c;
    break;
  case 0x3ea:
    local_58 = &local_78;
    local_50 = &local_70;
    break;
  case 0x3eb:
    local_58 = (double *)&local_68;
    local_50 = (double *)&local_64;
    break;
  case 0x3ec:
    local_58 = &local_88;
    local_50 = &local_80;
    break;
  default:
    GA::GAServices::error
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
    break;
  case 0x3ef:
    local_58 = &local_a8;
    local_50 = &local_98;
  }
  GA::GlobalArray::selectElem
            (in_stack_fffffffffffffdd0,
             (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0,
             (int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  GA::GlobalArray::selectElem
            (in_stack_fffffffffffffdd0,
             (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0,
             (int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  switch(local_1b8) {
  case 0x3e9:
    if (iVar1 == 0) {
      if (local_60 - local_5c < 0) {
        local_214 = -(local_60 - local_5c);
      }
      else {
        local_214 = local_60 - local_5c;
      }
      if (((1e-05 <= (double)local_214) || (local_60 != 0)) || (local_5c != 0)) {
        printf("not ok.\n");
        GA::GAServices::error
                  (in_stack_fffffffffffffdc0,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  case 0x3ea:
    if (iVar1 == 0) {
      if ((long)local_78 - (long)local_70 < 0) {
        this = (GAServices *)-((long)local_78 - (long)local_70);
      }
      else {
        this = (GAServices *)((long)local_78 - (long)local_70);
      }
      if (((1e-05 <= (double)(long)this) || (local_78 != 0.0)) || (local_70 != 0.0)) {
        printf("not ok.\n");
        GA::GAServices::error
                  (this,(char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  case 0x3eb:
    if (iVar1 == 0) {
      if (local_68 - local_64 < 0.0) {
        fVar2 = -(local_68 - local_64);
      }
      else {
        fVar2 = local_68 - local_64;
      }
      if (((1e-05 <= fVar2) || (local_68 != 0.0)) ||
         ((NAN(local_68) || ((local_64 != 0.0 || (NAN(local_64))))))) {
        printf("not ok.\n");
        GA::GAServices::error
                  (in_stack_fffffffffffffdc0,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  case 0x3ec:
    if (iVar1 == 0) {
      if (local_88 - local_80 < 0.0) {
        dVar3 = -(local_88 - local_80);
      }
      else {
        dVar3 = local_88 - local_80;
      }
      if ((((1e-05 <= dVar3) || (local_88 != 0.0)) || (NAN(local_88))) ||
         ((local_80 != 0.0 || (NAN(local_80))))) {
        printf("not ok.\n");
        GA::GAServices::error
                  (in_stack_fffffffffffffdc0,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  default:
    GA::GAServices::error
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
    break;
  case 0x3ef:
    if (iVar1 == 0) {
      if (local_a8 - local_98 < 0.0) {
        dVar3 = -(local_a8 - local_98);
      }
      else {
        dVar3 = local_a8 - local_98;
      }
      if ((((dVar3 < 1e-05) && (local_a8 == 0.0)) && (!NAN(local_a8))) &&
         ((local_98 == 0.0 && (!NAN(local_98))))) {
        if (local_a0 - local_90 < 0.0) {
          dVar3 = -(local_a0 - local_90);
        }
        else {
          dVar3 = local_a0 - local_90;
        }
        if (((dVar3 < 1e-05) && (local_a0 == 0.0)) &&
           ((!NAN(local_a0) && ((local_90 == 0.0 && (!NAN(local_90))))))) {
          printf("ok.\n");
          return;
        }
      }
      printf("not ok.\n");
      GA::GAServices::error
                (in_stack_fffffffffffffdc0,
                 (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
    }
  }
  return;
}

Assistant:

void 
test_median (GA::GlobalArray * g_a, GA::GlobalArray * g_b,
	     GA::GlobalArray * g_c, GA::GlobalArray * g_m)
{
  
  GA::GlobalArray *g_e;
  int index[MAXDIM];
  void *min, *max;
  int imin, imax;
  float fmin, fmax;
  long lmin, lmax;
  double dmin, dmax;
  DoubleComplex dcmin, dcmax;


  void *alpha, *beta;
  int ai = 1, bi = -1;
  long al = 1, bl = -1;
  float af = 1.0, bf = -1.0;
  double ad = 1.0, bd = -1.0;
  DoubleComplex adc = { 1.0, 0.0 };
  DoubleComplex bdc = {-1.0, 0.0 };

  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  void *val2;
  int ival2 = 6;
  double dval2 = 6.0;
  float fval2 = 6.0;
  long lval2 = 6;
  DoubleComplex dcval2;

  void *val3;
  int ival3 = 4;
  double dval3 = 4.0;
  float fval3 = 4.0;
  long lval3 = 4;
  DoubleComplex dcval3;

  int me = GA_Nodeid ();
  int type, ndim, dims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);

  switch (type)
    {
    case C_INT:
      alpha = (void *)&ai;
      beta = (void *)&bi;
      break;
    case C_DCPL:
      alpha = (void *)&adc;
      beta =(void *) &bdc;
      break;

    case C_DBL:
      alpha = (void *)&ad;
      beta = (void *)&bd;
      break;
    case C_FLOAT:
      alpha =(void *) &af;
      beta = (void *)&bf;
      break;
    case C_LONG:
      alpha = (void *)&al;
      beta = (void *)&bl;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }

  dcval.real = -2.0;
  dcval.imag = -0.0;

  dcval2.real = 6.0;
  dcval2.imag = 0.0;


  dcval3.real = 4.0;
  dcval3.imag = 0.0;


  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      val2 =(void *) &ival2;
      val3 = (void *)&ival3;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      val2 =(void *) &dcval2;
      val3 =(void *) &dcval3;
      break;
    case C_DBL:
      val = (void *)&dval;
      val2 = (void *)&dval2;
      val3 = (void *)&dval3;
      break;
    case C_FLOAT:
      val = (void *)&fval;
      val2 = (void *)&fval2;
      val3 = (void *)&fval3;
      break;
    case C_LONG:
      val = (void *)&lval;
      val2 = (void *)&lval2;
      val3 = (void *)&lval3;
      break;
    default:
      GA_Error ((char *)"test_median:test_median:wrong data type.", type);
    }

  if (me == 0)
    printf ("Testing GA_Median...");

  g_a->zero();
  g_b->zero();
  g_c->zero();
  g_m->zero();

  g_a->fill (val);
  g_b->fill (val2);
  g_c->fill (val3);

  g_m->median (g_a, g_b, g_c);
  
  /*
    The result array should        be g_c due to the value I chose: 
    val3 is the median of the three values val, val2, and val3
  */

  /* g_e = g_c - g_m */
  g_e = GA::SERVICES.createGA (g_a, (char *)"E");
  g_e->add (alpha, g_c, beta, g_m);
  
  switch (type)
    {
    case C_INT:
      max =(void *) &imax;
      min = (void *)&imin;
      break;
    case C_DCPL:
      max =(void *) &dcmax;
      min = (void *)&dcmin;
      break;
    case C_DBL:
      max = (void *)&dmax;
      min = (void *)&dmin;
      break;
    case C_FLOAT:
      max = (void *)&fmax;
      min = (void *)&fmin;
      break;
    case C_LONG:
      max = (void *)&lmax;
      min = (void *)&lmin;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }
  
  g_e->selectElem ((char *)"max", max, index);
  g_e->selectElem ((char *)"min", min, index);

  switch (type)
    {
      double r, m;
    case C_INT:
      if (me == 0)
	{
	  if (MISMATCHED (imax, imin) || (imax != 0) || (imin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DCPL:
      r = dcmax.real - dcmin.real;
      m = dcmax.imag - dcmin.imag;
      if (me == 0)
	{
	  if (MISMATCHED (dcmax.real, dcmin.real) || (dcmax.real != 0.0)
	      || (dcmin.real != 0.0) || MISMATCHED (dcmax.imag, dcmin.imag)
	      || (dcmax.imag != 0.0) || (dcmin.imag != 0.0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DBL:
      if (me == 0)
	{
	  if (MISMATCHED (dmax, dmin) || (dmax != 0) || (dmin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_FLOAT:
      if (me == 0)
	{
	  if (MISMATCHED (fmax, fmin) || (fmax != 0) || (fmin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_LONG:
      if (me == 0)
	{
	  if (MISMATCHED (lmax, lmin) || (lmax != 0) || (lmin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }


}